

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enemy.cpp
# Opt level: O1

void __thiscall
Enemy::update(Enemy *this,int width,Paddle *paddle,vector<Brick,_std::allocator<Brick>_> *bricks,
             Character *character,int currentTimeInMillis,bool winOrLose)

{
  float *pfVar1;
  pointer pBVar2;
  bool bVar3;
  Brick *brick;
  pointer other;
  float fVar4;
  vec2 vVar5;
  float fVar6;
  float fVar7;
  
  if (this->state == DEAD) {
    return;
  }
  fVar4 = (this->super_AABB).center.field_0.field_0.x;
  if ((fVar4 <= 32.0) || ((float)width + -32.0 <= fVar4)) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.2;
  }
  fVar6 = (this->velocity).field_0.field_0.x;
  (this->velocity).field_0.field_0.x = fVar6 + 0.0;
  (this->velocity).field_0.field_0.y = fVar7 + (this->velocity).field_0.field_0.y;
  fVar7 = -1.0;
  if ((fVar6 < -1.0) || (fVar7 = 1.0, 1.0 < fVar6)) {
    (this->velocity).field_0.field_0.x = fVar7;
  }
  fVar7 = (this->velocity).field_0.field_0.y;
  fVar6 = -4.0;
  if ((fVar7 < -4.0) || (fVar6 = 4.0, 4.0 < fVar7)) {
    (this->velocity).field_0.field_0.y = fVar6;
  }
  (this->super_AABB).center.field_0.field_0.x = fVar4 + (this->velocity).field_0.field_0.x;
  (this->super_AABB).center.field_0.field_0.y =
       (this->velocity).field_0.field_0.y + (this->super_AABB).center.field_0.field_0.y;
  fVar4 = AABB::getTop(&this->super_AABB);
  pfVar1 = &(this->startPos).field_0.field_0.y;
  if (*pfVar1 <= fVar4 && fVar4 != *pfVar1) {
    fVar4 = AABB::getLeft(&this->super_AABB);
    if (32.0 <= fVar4) {
      fVar4 = AABB::getRight(&this->super_AABB);
      if (fVar4 <= (float)width + -32.0) goto LAB_0012f62c;
      fVar4 = (((float)width + -32.0) - (this->super_AABB).halfDimension.field_0.field_0.x) + -1.0;
    }
    else {
      fVar4 = (this->super_AABB).halfDimension.field_0.field_0.x + 32.0 + 1.0;
    }
    (this->super_AABB).center.field_0.field_0.x = fVar4;
    (this->velocity).field_0.field_0.x = -(this->velocity).field_0.field_0.x;
  }
LAB_0012f62c:
  other = (bricks->super__Vector_base<Brick,_std::allocator<Brick>_>)._M_impl.
          super__Vector_impl_data._M_start;
  pBVar2 = (bricks->super__Vector_base<Brick,_std::allocator<Brick>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (other == pBVar2) {
      if ((!winOrLose) &&
         (bVar3 = AABB::intersectsAABB(&this->super_AABB,&character->super_AABB), bVar3)) {
        vVar5 = Character::getVelocity(character);
        if ((0.0 < vVar5.field_0._4_4_) &&
           (fVar4 = AABB::getBottom(&character->super_AABB),
           fVar4 < (this->super_AABB).center.field_0.field_0.y)) {
          *(undefined8 *)&this->state = 1;
          this->timeOfDeathInMillis = currentTimeInMillis;
          Character::bounce(character);
          return;
        }
        bVar3 = Character::isInvincible(character);
        if (!bVar3) {
          fVar4 = (this->super_AABB).center.field_0.field_0.x;
          Character::dieByEnemy
                    (character,currentTimeInMillis,
                     *(float *)(&DAT_001734f0 +
                               (ulong)((character->super_AABB).center.field_0.field_0.x <= fVar4 &&
                                      fVar4 != (character->super_AABB).center.field_0.field_0.x) * 4
                               ));
          return;
        }
      }
      return;
    }
    bVar3 = AABB::intersectsAABB(&this->super_AABB,&other->super_AABB);
    if (bVar3) {
      fVar7 = AABB::getBottom(&this->super_AABB);
      fVar4 = (other->super_AABB).center.field_0.field_0.y;
      if (fVar7 <= fVar4) {
        (this->super_AABB).center.field_0.field_0.y =
             (fVar4 - (other->super_AABB).halfDimension.field_0.field_0.y) -
             (this->super_AABB).halfDimension.field_0.field_0.y;
        (this->velocity).field_0.field_0.y = 0.0;
      }
      else if ((this->velocity).field_0.field_0.x <= 0.0) {
LAB_0012f6c6:
        if ((this->velocity).field_0.field_0.x <= 0.0 && (this->velocity).field_0.field_0.x != 0.0)
        {
          fVar4 = AABB::getLeft(&this->super_AABB);
          fVar7 = AABB::getRight(&other->super_AABB);
          if (fVar4 < fVar7) {
            fVar4 = AABB::getRight(&other->super_AABB);
            fVar4 = fVar4 + (this->super_AABB).halfDimension.field_0.field_0.x + 1.0;
            goto LAB_0012f701;
          }
        }
      }
      else {
        fVar4 = AABB::getRight(&this->super_AABB);
        fVar7 = AABB::getLeft(&other->super_AABB);
        if (fVar4 <= fVar7) goto LAB_0012f6c6;
        fVar4 = AABB::getLeft(&other->super_AABB);
        fVar4 = (fVar4 - (this->super_AABB).halfDimension.field_0.field_0.x) + -1.0;
LAB_0012f701:
        (this->super_AABB).center.field_0.field_0.x = fVar4;
        (this->velocity).field_0.field_0.x = -(this->velocity).field_0.field_0.x;
      }
    }
    other = other + 1;
  } while( true );
}

Assistant:

void Enemy::update(int width, Paddle& paddle, std::vector<Brick>& bricks, Character& character, int currentTimeInMillis, bool winOrLose) {
    if (state == DEAD) {
        return;
    }
    glm::vec2 acceleration = (center.x > BRICK_WIDTH && center.x < (width - BRICK_WIDTH)) ? GRAVITY : glm::vec2(0.0f, 0.0f);
    velocity += acceleration;
    if (velocity.x < -ENEMY_MAX_VELOCITY.x) {
        velocity.x = -ENEMY_MAX_VELOCITY.x;
    } else if (velocity.x > ENEMY_MAX_VELOCITY.x) {
        velocity.x = ENEMY_MAX_VELOCITY.x;
    }
    if (velocity.y < -ENEMY_MAX_VELOCITY.y) {
        velocity.y = -ENEMY_MAX_VELOCITY.y;
    } else if (velocity.y > ENEMY_MAX_VELOCITY.y) {
        velocity.y = ENEMY_MAX_VELOCITY.y;
    }
    center += velocity;
    if (getTop() > startPos.y) {
        if (getLeft() < BRICK_WIDTH) {
            center.x = BRICK_WIDTH + halfDimension.x + 1;
            velocity.x *= -1.0f;
        } else if (getRight() > width - BRICK_WIDTH) {
            center.x = width - BRICK_WIDTH - halfDimension.x - 1;
            velocity.x *= -1.0f;
        }
    }
    for (Brick& brick : bricks) {
        if (intersectsAABB(brick)) {
            if (getBottom() > brick.center.y) {
                if (velocity.x > 0.0f && getRight() > brick.getLeft()) {
                    center.x = brick.getLeft() - halfDimension.x - 1;
                    velocity.x *= -1.0f;
                } else if (velocity.x < 0.0f && getLeft() < brick.getRight()) {
                    center.x = brick.getRight() + halfDimension.x + 1;
                    velocity.x *= -1.0f;
                }
            } else {
                center.y = brick.center.y - brick.halfDimension.y - halfDimension.y;
                velocity.y = 0.0f;
            }
        }
    }
    if (!winOrLose) {
        if (intersectsAABB(character)) {
            if (character.getVelocity().y > 0.0 && character.getBottom() < center.y) {
                state = DEAD;
                timeOfDeathInMillis = currentTimeInMillis;
                velocity.x = 0.0f;
                character.bounce();
            } else if (!character.isInvincible()) {
                character.dieByEnemy(currentTimeInMillis, character.center.x < center.x ? -1.0f : 1.0f);
            }
        }
    }
}